

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall btQuantizedBvh::buildTree(btQuantizedBvh *this,int startIndex,int endIndex)

{
  int iVar1;
  int startIndex_00;
  int endIndex_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  btVector3 bVar2;
  int in_stack_00000018;
  int treeSizeInBytes;
  int sizeQuantizedNode;
  int escapeIndex;
  int rightChildNodexIndex;
  int leftChildNodexIndex;
  int internalNodeIndex;
  int curIndex;
  int numIndices;
  int i;
  int splitIndex;
  int splitAxis;
  int in_stack_00000078;
  int in_stack_0000007c;
  btQuantizedBvh *in_stack_00000080;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_1c;
  int iVar4;
  
  iVar1 = *(int *)(in_RDI + 0x3c);
  if (in_EDX - in_ESI == 1) {
    assignInternalNodeFromLeafNode
              ((btQuantizedBvh *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + 1;
  }
  else {
    startIndex_00 = calcSplittingAxis(in_stack_00000080,in_stack_0000007c,in_stack_00000078);
    endIndex_00 = sortAndCalcSplittingIndex(_splitIndex,i,numIndices,curIndex);
    setInternalNodeAabbMin
              ((btQuantizedBvh *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_RDI >> 0x20),
               (btVector3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_1c = in_ESI;
    setInternalNodeAabbMax
              ((btQuantizedBvh *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_RDI >> 0x20),
               (btVector3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    iVar4 = local_1c;
    for (; local_1c < in_EDX; local_1c = local_1c + 1) {
      uVar3 = *(undefined4 *)(in_RDI + 0x3c);
      getAabbMin((btQuantizedBvh *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      bVar2 = getAabbMax((btQuantizedBvh *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c);
      mergeInternalNodeAabb
                (bVar2.m_floats._8_8_,(int)bVar2.m_floats[1],
                 (btVector3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (btVector3 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + 1;
    buildTree((btQuantizedBvh *)CONCAT44(iVar4,in_EDX),startIndex_00,endIndex_00);
    buildTree((btQuantizedBvh *)CONCAT44(iVar4,in_EDX),startIndex_00,endIndex_00);
    if (((*(byte *)(in_RDI + 0x40) & 1) != 0) &&
       (in_stack_ffffffffffffffa4 = (*(int *)(in_RDI + 0x3c) - iVar1) * 0x10,
       0x800 < in_stack_ffffffffffffffa4)) {
      updateSubtreeHeaders(_sizeQuantizedNode,treeSizeInBytes,in_stack_00000018);
    }
    setInternalNodeEscapeIndex
              ((btQuantizedBvh *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  return;
}

Assistant:

void	btQuantizedBvh::buildTree	(int startIndex,int endIndex)
{
#ifdef DEBUG_TREE_BUILDING
	gStackDepth++;
	if (gStackDepth > gMaxStackDepth)
		gMaxStackDepth = gStackDepth;
#endif //DEBUG_TREE_BUILDING


	int splitAxis, splitIndex, i;
	int numIndices =endIndex-startIndex;
	int curIndex = m_curNodeIndex;

	btAssert(numIndices>0);

	if (numIndices==1)
	{
#ifdef DEBUG_TREE_BUILDING
		gStackDepth--;
#endif //DEBUG_TREE_BUILDING
		
		assignInternalNodeFromLeafNode(m_curNodeIndex,startIndex);

		m_curNodeIndex++;
		return;	
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.
	
	splitAxis = calcSplittingAxis(startIndex,endIndex);

	splitIndex = sortAndCalcSplittingIndex(startIndex,endIndex,splitAxis);

	int internalNodeIndex = m_curNodeIndex;
	
	//set the min aabb to 'inf' or a max value, and set the max aabb to a -inf/minimum value.
	//the aabb will be expanded during buildTree/mergeInternalNodeAabb with actual node values
	setInternalNodeAabbMin(m_curNodeIndex,m_bvhAabbMax);//can't use btVector3(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY)) because of quantization
	setInternalNodeAabbMax(m_curNodeIndex,m_bvhAabbMin);//can't use btVector3(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY)) because of quantization
	
	
	for (i=startIndex;i<endIndex;i++)
	{
		mergeInternalNodeAabb(m_curNodeIndex,getAabbMin(i),getAabbMax(i));
	}

	m_curNodeIndex++;
	

	//internalNode->m_escapeIndex;
	
	int leftChildNodexIndex = m_curNodeIndex;

	//build left child tree
	buildTree(startIndex,splitIndex);

	int rightChildNodexIndex = m_curNodeIndex;
	//build right child tree
	buildTree(splitIndex,endIndex);

#ifdef DEBUG_TREE_BUILDING
	gStackDepth--;
#endif //DEBUG_TREE_BUILDING

	int escapeIndex = m_curNodeIndex - curIndex;

	if (m_useQuantization)
	{
		//escapeIndex is the number of nodes of this subtree
		const int sizeQuantizedNode =sizeof(btQuantizedBvhNode);
		const int treeSizeInBytes = escapeIndex * sizeQuantizedNode;
		if (treeSizeInBytes > MAX_SUBTREE_SIZE_IN_BYTES)
		{
			updateSubtreeHeaders(leftChildNodexIndex,rightChildNodexIndex);
		}
	} else
	{

	}

	setInternalNodeEscapeIndex(internalNodeIndex,escapeIndex);

}